

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void leave_test(int outcome)

{
  int outcome_local;
  
  if (leave_means_exit != 0) {
    exit(outcome);
  }
  longjmp((__jmp_buf_tag *)start_test_jump,1);
}

Assistant:

static void leave_test(int outcome) {
	PCUT_DEBUG("leave_test(outcome=%d), will_exit=%s", outcome,
		leave_means_exit ? "yes" : "no");
	if (leave_means_exit) {
		exit(outcome);
	}

#ifndef PCUT_NO_LONG_JUMP
	longjmp(start_test_jump, 1);
#endif
}